

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall
mkvmuxer::Frame::AddAdditionalData(Frame *this,uint8_t *additional,uint64_t length,uint64_t add_id)

{
  uint8_t *__dest;
  
  __dest = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
  if (__dest != (uint8_t *)0x0) {
    if (this->additional_ != (uint8_t *)0x0) {
      operator_delete__(this->additional_);
    }
    this->additional_ = __dest;
    this->additional_length_ = length;
    this->add_id_ = add_id;
    memcpy(__dest,additional,length);
  }
  return __dest != (uint8_t *)0x0;
}

Assistant:

bool Frame::AddAdditionalData(const uint8_t* additional, uint64_t length,
                              uint64_t add_id) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] additional_;
  additional_ = data;
  additional_length_ = length;
  add_id_ = add_id;

  memcpy(additional_, additional, static_cast<size_t>(additional_length_));
  return true;
}